

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

void __thiscall
pstore::index::details::internal_node::internal_node
          (internal_node *this,index_pointer *existing_leaf,index_pointer *new_leaf,
          hash_type existing_hash,hash_type new_hash)

{
  *(undefined8 *)(this->signature_)._M_elems = 0x6c616e7265746e49;
  this->bitmap_ = 1L << ((byte)new_hash & 0x3f) | 1L << (existing_hash & 0x3f);
  this->children_[0].internal_ = (internal_node *)0x0;
  this->children_[new_hash >= existing_hash] = *new_leaf;
  this->children_[new_hash < existing_hash] = *existing_leaf;
  return;
}

Assistant:

internal_node::internal_node (index_pointer const & existing_leaf,
                                          index_pointer const & new_leaf,
                                          hash_type const existing_hash, hash_type const new_hash)
                    : bitmap_ (hash_type{1} << existing_hash | hash_type{1} << new_hash) {

                auto const index_a = get_new_index (new_hash, existing_hash);
                auto const index_b = static_cast<unsigned> (index_a == 0);

                PSTORE_ASSERT ((index_a & 1) ==
                               index_a); //! OCLINT(PH - bitwise in conditional is ok)
                PSTORE_ASSERT ((index_b & 1) ==
                               index_b); //! OCLINT(PH - bitwise in conditional is ok)
                PSTORE_ASSERT (index_a != index_b);

                children_[index_a] = index_pointer{new_leaf};
                children_[index_b] = existing_leaf;
            }